

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall soplex::SPxScaler<double>::setup(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  DataArray<int> *pDVar1;
  int i;
  long lVar2;
  
  pDVar1 = &(lp->super_LPColSetBase<double>).scaleExp;
  this->m_activeColscaleExp = pDVar1;
  this->m_activeRowscaleExp = &(lp->super_LPRowSetBase<double>).scaleExp;
  DataArray<int>::reSize(pDVar1,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)
  ;
  DataArray<int>::reSize
            (this->m_activeRowscaleExp,
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  pDVar1 = this->m_activeColscaleExp;
  for (lVar2 = 0; lVar2 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar2 = lVar2 + 1) {
    pDVar1->data[lVar2] = 0;
  }
  pDVar1 = this->m_activeRowscaleExp;
  for (lVar2 = 0; lVar2 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar2 = lVar2 + 1) {
    pDVar1->data[lVar2] = 0;
  }
  lp->lp_scaler = this;
  return;
}

Assistant:

void SPxScaler<R>::setup(SPxLPBase<R>& lp)
{
   assert(lp.isConsistent());
   m_activeColscaleExp = &lp.LPColSetBase<R>::scaleExp;
   m_activeRowscaleExp = &lp.LPRowSetBase<R>::scaleExp;
   m_activeColscaleExp->reSize(lp.nCols());
   m_activeRowscaleExp->reSize(lp.nRows());

   for(int i = 0; i < lp.nCols(); ++i)
      (*m_activeColscaleExp)[i] = 0;

   for(int i = 0; i < lp.nRows(); ++i)
      (*m_activeRowscaleExp)[i] = 0;

   lp.lp_scaler = this;
}